

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut.c
# Opt level: O2

Sbd_Sto_t *
Sbd_StoAlloc(Gia_Man_t *pGia,Vec_Int_t *vMirrors,int nLutSize,int nCutSize,int nCutNum,int fCutMin,
            int fVerbose)

{
  size_t __size;
  int iVar1;
  int iVar2;
  Sbd_Sto_t *pSVar3;
  abctime aVar4;
  Vec_Int_t *pVVar5;
  Vec_Wec_t *pVVar6;
  word *pEntry;
  Vec_Mem_t *p;
  ulong uVar7;
  
  if (nCutSize < nLutSize) {
    __assert_fail("nLutSize <= nCutSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCut.c"
                  ,0x29e,
                  "Sbd_Sto_t *Sbd_StoAlloc(Gia_Man_t *, Vec_Int_t *, int, int, int, int, int)");
  }
  if (0xe < nCutSize) {
    __assert_fail("nCutSize < SBD_CUT_NO_LEAF",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCut.c"
                  ,0x29f,
                  "Sbd_Sto_t *Sbd_StoAlloc(Gia_Man_t *, Vec_Int_t *, int, int, int, int, int)");
  }
  if (8 < nCutSize - 2U) {
    __assert_fail("nCutSize > 1 && nCutSize <= SBD_MAX_CUTSIZE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCut.c"
                  ,0x2a0,
                  "Sbd_Sto_t *Sbd_StoAlloc(Gia_Man_t *, Vec_Int_t *, int, int, int, int, int)");
  }
  if (nCutNum - 2U < 499) {
    pSVar3 = (Sbd_Sto_t *)calloc(1,0x187f8);
    aVar4 = Abc_Clock();
    pSVar3->clkStart = aVar4;
    pSVar3->nLutSize = nLutSize;
    pSVar3->nCutSize = nCutSize;
    pSVar3->nCutNum = nCutNum;
    pSVar3->fCutMin = fCutMin;
    pSVar3->fVerbose = fVerbose;
    pSVar3->pGia = pGia;
    pSVar3->vMirrors = vMirrors;
    pVVar5 = Vec_IntStart(pGia->nObjs);
    pSVar3->vDelays = pVVar5;
    pVVar5 = Vec_IntStart(pGia->nObjs);
    pSVar3->vLevels = pVVar5;
    pVVar5 = Vec_IntAlloc(pGia->nObjs);
    pSVar3->vRefs = pVVar5;
    iVar2 = pGia->nObjs;
    pVVar6 = (Vec_Wec_t *)malloc(0x10);
    iVar1 = 8;
    if (6 < iVar2 - 1U) {
      iVar1 = iVar2;
    }
    pVVar6->nCap = iVar1;
    if (iVar1 == 0) {
      pVVar5 = (Vec_Int_t *)0x0;
    }
    else {
      pVVar5 = (Vec_Int_t *)calloc((long)iVar1,0x10);
    }
    pVVar6->pArray = pVVar5;
    pVVar6->nSize = iVar2;
    pSVar3->vCuts = pVVar6;
    if (fCutMin == 0) {
      p = (Vec_Mem_t *)0x0;
    }
    else {
      uVar7 = (ulong)(uint)(1 << ((char)nCutSize - 6U & 0x1f));
      if ((uint)nCutSize < 7) {
        uVar7 = 1;
      }
      __size = uVar7 * 8;
      pEntry = (word *)malloc(__size);
      p = (Vec_Mem_t *)calloc(1,0x30);
      p->nEntrySize = (int)uVar7;
      p->LogPageSze = 0xc;
      p->PageMask = 0xfff;
      p->iPage = -1;
      iVar2 = Abc_PrimeCudd(10000);
      pVVar5 = Vec_IntAlloc(iVar2);
      pVVar5->nSize = iVar2;
      if (pVVar5->pArray != (int *)0x0) {
        memset(pVVar5->pArray,0xff,(long)iVar2 << 2);
      }
      p->vTable = pVVar5;
      pVVar5 = Vec_IntAlloc(10000);
      p->vNexts = pVVar5;
      memset(pEntry,0,__size);
      iVar2 = Vec_MemHashInsert(p,pEntry);
      if (iVar2 != 0) {
        __assert_fail("Value == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                      ,0x19e,"Vec_Mem_t *Vec_MemAllocForTT(int, int)");
      }
      memset(pEntry,0xaa,__size);
      iVar2 = Vec_MemHashInsert(p,pEntry);
      if (iVar2 != 1) {
        __assert_fail("Value == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                      ,0x1a3,"Vec_Mem_t *Vec_MemAllocForTT(int, int)");
      }
      free(pEntry);
    }
    pSVar3->vTtMem = p;
    return pSVar3;
  }
  __assert_fail("nCutNum > 1 && nCutNum < SBD_MAX_CUTNUM",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCut.c"
                ,0x2a1,"Sbd_Sto_t *Sbd_StoAlloc(Gia_Man_t *, Vec_Int_t *, int, int, int, int, int)")
  ;
}

Assistant:

Sbd_Sto_t * Sbd_StoAlloc( Gia_Man_t * pGia, Vec_Int_t * vMirrors, int nLutSize, int nCutSize, int nCutNum, int fCutMin, int fVerbose )
{
    Sbd_Sto_t * p;
    assert( nLutSize <= nCutSize );
    assert( nCutSize < SBD_CUT_NO_LEAF );
    assert( nCutSize > 1 && nCutSize <= SBD_MAX_CUTSIZE );
    assert( nCutNum > 1 && nCutNum < SBD_MAX_CUTNUM );
    p = ABC_CALLOC( Sbd_Sto_t, 1 );
    p->clkStart = Abc_Clock();
    p->nLutSize = nLutSize;
    p->nCutSize = nCutSize;
    p->nCutNum  = nCutNum;
    p->fCutMin  = fCutMin;
    p->fVerbose = fVerbose;
    p->pGia     = pGia;
    p->vMirrors = vMirrors;
    p->vDelays  = Vec_IntStart( Gia_ManObjNum(pGia) );
    p->vLevels  = Vec_IntStart( Gia_ManObjNum(pGia) );
    p->vRefs    = Vec_IntAlloc( Gia_ManObjNum(pGia) );
    p->vCuts    = Vec_WecStart( Gia_ManObjNum(pGia) );
    p->vTtMem   = fCutMin ? Vec_MemAllocForTT( nCutSize, 0 ) : NULL;
    return p;
}